

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_32x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  code *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int8_t *piVar11;
  undefined4 uVar12;
  undefined4 *puVar13;
  undefined7 in_register_00000009;
  long lVar14;
  int32_t *piVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int16_t *piVar19;
  undefined4 *puVar20;
  longlong *plVar21;
  undefined1 in_XMM1 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i in [64];
  undefined1 auStack_4a8 [16];
  undefined1 auStack_498 [16];
  undefined1 auStack_488 [16];
  undefined1 auStack_478 [16];
  undefined1 auStack_468 [16];
  undefined1 auStack_458 [8];
  undefined8 uStack_450;
  undefined1 auStack_448 [4];
  undefined4 local_444;
  code *local_440;
  longlong local_438 [48];
  undefined4 local_2b8 [162];
  
  piVar11 = av1_fwd_txfm_shift_ls[0x10];
  uVar16 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar2 = *(code **)((long)row_highbd_txfm32x8_arr + uVar16);
  local_440 = *(code **)((long)col_highbd_txfm8x32_arr + uVar16);
  local_444 = 0xc;
  iVar17 = (int)*av1_fwd_txfm_shift_ls[0x10];
  piVar19 = input + 0x1c;
  lVar14 = 0x70;
  do {
    auVar22 = pmovsxwd(in_XMM1,*(undefined8 *)(piVar19 + -0x1c));
    auVar23 = pmovsxwd(in_XMM2,*(undefined8 *)(piVar19 + -0x18));
    auVar25 = pmovsxwd(in_XMM3,*(undefined8 *)(piVar19 + -0x14));
    auVar26 = pmovsxwd(in_XMM4,*(undefined8 *)(piVar19 + -0x10));
    auVar24._0_4_ = auVar22._0_4_ << iVar17;
    auVar24._4_4_ = auVar22._4_4_;
    auVar24._8_4_ = auVar22._8_4_;
    auVar24._12_4_ = auVar22._12_4_;
    auVar27._0_4_ = auVar23._0_4_ << iVar17;
    auVar27._4_4_ = auVar23._4_4_;
    auVar27._8_4_ = auVar23._8_4_;
    auVar27._12_4_ = auVar23._12_4_;
    *(undefined1 (*) [16])(auStack_4a8 + lVar14) = auVar24;
    *(undefined1 (*) [16])(auStack_498 + lVar14) = auVar27;
    auVar23._0_4_ = auVar25._0_4_ << iVar17;
    auVar23._4_4_ = auVar25._4_4_;
    auVar23._8_4_ = auVar25._8_4_;
    auVar23._12_4_ = auVar25._12_4_;
    *(undefined1 (*) [16])(auStack_488 + lVar14) = auVar23;
    auVar25._0_4_ = auVar26._0_4_ << iVar17;
    auVar25._4_4_ = auVar26._4_4_;
    auVar25._8_4_ = auVar26._8_4_;
    auVar25._12_4_ = auVar26._12_4_;
    *(undefined1 (*) [16])(auStack_478 + lVar14) = auVar25;
    auVar22 = pmovsxwd(auVar24,*(undefined8 *)(piVar19 + -0xc));
    auVar24 = pmovsxwd(auVar27,*(undefined8 *)(piVar19 + -8));
    auVar23 = pmovsxwd(auVar23,*(undefined8 *)(piVar19 + -4));
    auVar27 = pmovsxwd(auVar25,*(undefined8 *)piVar19);
    in_XMM1._0_4_ = auVar22._0_4_ << iVar17;
    in_XMM1._4_4_ = auVar22._4_4_;
    in_XMM1._8_4_ = auVar22._8_4_;
    in_XMM1._12_4_ = auVar22._12_4_;
    *(undefined1 (*) [16])(auStack_468 + lVar14) = in_XMM1;
    in_XMM2._0_4_ = auVar24._0_4_ << iVar17;
    in_XMM2._4_4_ = auVar24._4_4_;
    in_XMM2._8_4_ = auVar24._8_4_;
    in_XMM2._12_4_ = auVar24._12_4_;
    in_XMM3._0_4_ = auVar23._0_4_ << iVar17;
    in_XMM3._4_4_ = auVar23._4_4_;
    in_XMM3._8_4_ = auVar23._8_4_;
    in_XMM3._12_4_ = auVar23._12_4_;
    *(undefined1 (*) [16])(auStack_458 + lVar14) = in_XMM2;
    *(undefined1 (*) [16])(auStack_448 + lVar14) = in_XMM3;
    in_XMM4._0_4_ = auVar27._0_4_ << iVar17;
    in_XMM4._4_4_ = auVar27._4_4_;
    in_XMM4._8_4_ = auVar27._8_4_;
    in_XMM4._12_4_ = auVar27._12_4_;
    *(undefined1 (*) [16])((long)local_438 + lVar14) = in_XMM4;
    lVar14 = lVar14 + 0x80;
    piVar19 = piVar19 + stride;
  } while (lVar14 != 0x470);
  uVar16 = 0xfffffffffffffffe;
  plVar21 = local_438;
  do {
    uStack_450 = 0x42d545;
    (*pcVar2)(plVar21,plVar21,0xd,8);
    uVar16 = uVar16 + 2;
    plVar21 = plVar21 + 4;
  } while (uVar16 < 6);
  uStack_450 = 0x42d564;
  col_txfm_16x16_rounding((__m128i *)local_438,-(int)piVar11[1]);
  pcVar2 = local_440;
  uVar12 = local_444;
  puVar13 = local_2b8;
  piVar15 = coeff + 0x18;
  lVar14 = 0;
  do {
    lVar18 = -0x20;
    puVar20 = puVar13;
    do {
      auVar22 = *(undefined1 (*) [16])(puVar20 + -0x60);
      uVar7 = puVar20[-0x20];
      uVar8 = puVar20[-0x1f];
      uVar9 = puVar20[-0x1e];
      uVar10 = puVar20[-0x1d];
      uVar3 = *puVar20;
      uVar4 = puVar20[1];
      uVar5 = puVar20[2];
      uVar6 = puVar20[3];
      auVar28._0_8_ = auVar22._0_8_;
      auVar28._8_4_ = auVar22._4_4_;
      auVar28._12_4_ = puVar20[-0x3f];
      auVar26._0_8_ = CONCAT44(puVar20[-0x3e],auVar22._8_4_);
      auVar26._8_4_ = auVar22._12_4_;
      auVar26._12_4_ = puVar20[-0x3d];
      puVar1 = (undefined8 *)((long)piVar15 + lVar18 + -0x40);
      *puVar1 = CONCAT44(puVar20[-0x40],auVar22._0_4_);
      puVar1[1] = CONCAT44(uVar3,uVar7);
      puVar1 = (undefined8 *)((long)piVar15 + lVar18 + -0x20);
      *puVar1 = auVar28._8_8_;
      *(undefined4 *)(puVar1 + 2) = uVar8;
      *(undefined4 *)((long)puVar1 + 0x14) = uVar4;
      puVar1 = (undefined8 *)((long)piVar15 + lVar18);
      *puVar1 = auVar26._0_8_;
      *(undefined4 *)(puVar1 + 1) = uVar9;
      *(undefined4 *)((long)puVar1 + 0xc) = uVar5;
      puVar1 = (undefined8 *)((long)piVar15 + lVar18 + 0x20);
      *puVar1 = auVar26._8_8_;
      *(undefined4 *)(puVar1 + 2) = uVar10;
      *(undefined4 *)((long)puVar1 + 0x14) = uVar6;
      puVar20 = puVar20 + 0x80;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0);
    lVar14 = lVar14 + 1;
    puVar13 = puVar13 + 4;
    piVar15 = piVar15 + 0x20;
  } while (lVar14 != 8);
  uStack_450 = 0x42d617;
  (*local_440)(coeff,coeff,local_444,2);
  uStack_450 = 0x42d62b;
  (*pcVar2)(coeff + 4,coeff + 4,uVar12,2);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X8];
  const int txw_idx = get_txw_idx(TX_32X8);
  const int txh_idx = get_txh_idx(TX_32X8);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm32x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  const int txfm_size_col = tx_size_wide[TX_32X8];
  const int txfm_size_row = tx_size_high[TX_32X8];
  const int num_col = txfm_size_row >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 8);
  for (int i = 0; i < txfm_size_row; i += 2) {
    col_txfm((in + i), (in + i), bitcol, txfm_size_row);
  }

  col_txfm_16x16_rounding(&in[0], -shift[1]);
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_col; i++) {
    row_txfm((outcoef128 + i), (outcoef128 + i), bitrow, num_col);
  }
  (void)bd;
}